

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

void * reg_malloc(c2m_ctx_t c2m_ctx,size_t s)

{
  void *obj;
  void *mem;
  size_t s_local;
  c2m_ctx_t c2m_ctx_local;
  
  obj = malloc(s);
  if (obj == (void *)0x0) {
    alloc_error(c2m_ctx,"no memory");
  }
  VARR_void_ptr_tpush(c2m_ctx->reg_memory,obj);
  return obj;
}

Assistant:

static void *reg_malloc (c2m_ctx_t c2m_ctx, size_t s) {
  void *mem = malloc (s);

  if (mem == NULL) alloc_error (c2m_ctx, "no memory");
  VARR_PUSH (void_ptr_t, reg_memory, mem);
  return mem;
}